

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

bool __thiscall ExternalTester::testAllAcceleration(ExternalTester *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  _Setw _Var4;
  int iVar5;
  TwoOneExpSinCos *f_00;
  ostream *poVar6;
  Two3KExpSinCos *f_01;
  char *local_520;
  bool local_419;
  bool local_3a5;
  bool local_399;
  bool local_31d;
  bool local_311;
  bool local_291;
  bool local_285;
  bool local_279;
  bool local_1fd;
  bool local_1f1;
  bool local_171;
  int local_fc;
  uint uStack_f8;
  int t;
  TypeOneDRule pwp_rule [4];
  int wthird;
  int wsecond;
  bool pass;
  TasmanianSparseGrid grid;
  BaseFunction *f1out;
  BaseFunction *f;
  ExternalTester *this_local;
  
  f_01 = &this->f23Kexpsincos;
  f_00 = &this->f21expsincos;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&wsecond);
  iVar2 = (**(f_01->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_01->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            ((int)&wsecond,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x1,0.0,0.0,
             (char *)0x0,(int *)0x0);
  bVar1 = testAcceleration(this,&f_01->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            ((int)&wsecond,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x1,0.0,0.0,
             (char *)0x0,(int *)0x0);
  local_171 = false;
  if (bVar1) {
    local_171 = testAcceleration(this,&f_00->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  if (local_171 == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"global");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"FAIL");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"global");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Pass");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = (**(f_01->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_01->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeSequenceGrid
            ((int)&wsecond,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x6,(int *)0x0);
  local_1f1 = false;
  if (local_171 != false) {
    local_1f1 = testAcceleration(this,&f_01->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeSequenceGrid
            ((int)&wsecond,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x6,(int *)0x0);
  local_1fd = false;
  if (local_1f1 != false) {
    local_1fd = testAcceleration(this,&f_00->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  wthird._3_1_ = local_1fd;
  if (local_1fd == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"sequence");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"FAIL");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"sequence");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Pass");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  _uStack_f8 = 0x2600000025;
  pwp_rule[0] = rule_semilocalp;
  pwp_rule[1] = rule_localpb;
  for (local_fc = 0; local_fc < 0xc; local_fc = local_fc + 1) {
    iVar3 = (**(f_01->super_BaseFunction)._vptr_BaseFunction)();
    iVar5 = (*(f_01->super_BaseFunction)._vptr_BaseFunction[1])();
    iVar2 = local_fc;
    if (local_fc < 0) {
      iVar2 = local_fc + 3;
    }
    TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
              ((int)&wsecond,iVar3,iVar5,6 - (uint)(iVar2 >> 2 == rule_none),iVar2 >> 2,
               (int *)(ulong)(&uStack_f8)[local_fc % 4]);
    local_279 = false;
    if (wthird._3_1_ != false) {
      local_279 = testAcceleration(this,&f_01->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
    }
    wthird._3_1_ = local_279;
  }
  iVar2 = TwoOneExpNX2::getNumInputs(&this->f21nx2);
  iVar3 = TwoOneExpNX2::getNumOutputs(&this->f21nx2);
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)&wsecond,iVar2,iVar3,5,rule_clenshawcurtis,(int *)0x25);
  TasGrid::TasmanianSparseGrid::favorSparseAcceleration(SUB81(&wsecond,0));
  local_285 = false;
  if (wthird._3_1_ != false) {
    local_285 = testAcceleration(this,&(this->f21nx2).super_BaseFunction,
                                 (TasmanianSparseGrid *)&wsecond);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)&wsecond,iVar2,iVar3,5,rule_clenshawcurtis0,(int *)0x27);
  TasGrid::TasmanianSparseGrid::favorSparseAcceleration(SUB81(&wsecond,0));
  local_291 = false;
  if (local_285 != false) {
    local_291 = testAcceleration(this,&f_00->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  if (local_291 == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"local polynomial");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"FAIL");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"local polynomial");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Pass");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = (**(f_01->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_01->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeFourierGrid
            ((int)&wsecond,iVar2,iVar3,type_iptotal,(int *)0x1,(int *)0x0);
  local_311 = false;
  if (local_291 != false) {
    local_311 = testAcceleration(this,&f_01->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeFourierGrid
            ((int)&wsecond,iVar2,iVar3,type_iptotal,(int *)0x1,(int *)0x0);
  local_31d = false;
  if (local_311 != false) {
    local_31d = testAcceleration(this,&f_00->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  if (local_31d == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"fourier");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"FAIL");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"fourier");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Pass");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = (**(f_01->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_01->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)&wsecond,iVar2,iVar3,2,(int *)0x3);
  local_399 = false;
  if (local_31d != false) {
    local_399 = testAcceleration(this,&f_01->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)();
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])();
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)&wsecond,iVar2,iVar3,4,(int *)0x1);
  local_3a5 = false;
  if (local_399 != false) {
    local_3a5 = testAcceleration(this,&f_00->super_BaseFunction,(TasmanianSparseGrid *)&wsecond);
  }
  if (local_3a5 == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"wavelet");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"FAIL");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"wavelet");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Pass");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  local_419 = false;
  if (local_3a5 != false) {
    local_419 = testGpuCaching(this);
  }
  if (local_419 == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"caching");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"FAIL");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"caching");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Pass");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"gpu-to-gpu");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Skipped (needs Tasmanian_ENABLE_CUDA=ON)");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  if ((this->verbose & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    _Var4 = std::setw(0x1c);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"load-values");
    _Var4 = std::setw(0xf);
    poVar6 = std::operator<<(poVar6,_Var4);
    poVar6 = std::operator<<(poVar6,"Skipped (needs Tasmanian_ENABLE_CUDA=ON)");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"      Acceleration                        all");
  _Var4 = std::setw(0xf);
  poVar6 = std::operator<<(poVar6,_Var4);
  if (local_419 == false) {
    local_520 = "FAIL";
  }
  else {
    local_520 = "Pass";
  }
  poVar6 = std::operator<<(poVar6,local_520);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&wsecond);
  return local_419;
}

Assistant:

bool ExternalTester::testAllAcceleration() const{
    const BaseFunction *f = &f23Kexpsincos;
    const BaseFunction *f1out = &f21expsincos;
    TasmanianSparseGrid grid;
    bool pass = true;

    int wsecond = 28, wthird = 15;

    grid.makeGlobalGrid(f->getNumInputs(), f->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_clenshawcurtis);
    pass = pass && testAcceleration(f, grid);
    grid.makeGlobalGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_clenshawcurtis);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "global" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "global" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeSequenceGrid(f->getNumInputs(), f->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_leja);
    pass = pass && testAcceleration(f, grid);
    grid.makeSequenceGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_leja);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "sequence" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "sequence" << setw(wthird) << "FAIL" << endl;
    }

    // for the purpose of testing CUDA evaluations, test all three localp rules vs orders 0, 1, and 2
    // for order 0, regardless of the selected rule, thegrid should switch to localp
    TasGrid::TypeOneDRule pwp_rule[4] = {TasGrid::rule_localp, TasGrid::rule_localp0, TasGrid::rule_semilocalp, TasGrid::rule_localpb};
    for(int t=0; t<12; t++){
        grid.makeLocalPolynomialGrid(f->getNumInputs(), f->getNumOutputs(), ((t / 4 == 0) ? 5 : 6), (t / 4), pwp_rule[t % 4]);
        pass = pass && testAcceleration(f, grid);
    }
    // test cusparse sparse mat times dense vec used in accel_type cuda, also try both sparse and dense flavors
    grid.makeLocalPolynomialGrid(f21nx2.getNumInputs(), f21nx2.getNumOutputs(), 5, 1, TasGrid::rule_localp);
    grid.favorSparseAcceleration(true);
    pass = pass && testAcceleration(&f21nx2, grid);
    grid.makeLocalPolynomialGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, 2, TasGrid::rule_semilocalp);
    grid.favorSparseAcceleration(false);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "local polynomial" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "local polynomial" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeFourierGrid(f->getNumInputs(), f->getNumOutputs(), 4, TasGrid::type_level);
    pass = pass && testAcceleration(f, grid);
    grid.makeFourierGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 4, TasGrid::type_level);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "fourier" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "fourier" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeWaveletGrid(f->getNumInputs(), f->getNumOutputs(), 2, 3);
    pass = pass && testAcceleration(f, grid);
    grid.makeWaveletGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 4, 1);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "wavelet" << setw(wthird) << "FAIL" << endl;
    }

    pass = pass && testGpuCaching();
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "caching" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "caching" << setw(wthird) << "FAIL" << endl;
    }

    #ifdef Tasmanian_ENABLE_GPU
    pass = pass && testGPU2GPUevaluations();
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "FAIL" << endl;
    }
    #else
    if (verbose) cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "Skipped (needs Tasmanian_ENABLE_CUDA=ON)" << endl;
    #endif // Tasmanian_ENABLE_GPU

    #ifdef Tasmanian_ENABLE_GPU
    pass = pass && testAcceleratedLoadValues(rule_clenshawcurtis) && testAcceleratedLoadValues(rule_rleja) &&
                   testAcceleratedLoadValues(rule_localp) && testAcceleratedLoadValues(rule_fourier) && testAcceleratedLoadValues(rule_wavelet);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "FAIL" << endl;
    }
    #else
    if (verbose) cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "Skipped (needs Tasmanian_ENABLE_CUDA=ON)" << endl;
    #endif

    cout << "      Acceleration                        all" << setw(15) << ((pass) ? "Pass" : "FAIL") << endl;

    return pass;
}